

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpAuxiliary
               (OpCode op,OpLayoutAuxiliary *playout,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  VarArrayVarCount *pVVar4;
  PropertyIdArray *pPVar5;
  ScriptContext *this;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  AuxArray<double> *pAVar8;
  AuxArray<int> *pAVar9;
  AuxArray<void_*> *pAVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  undefined6 in_register_0000003a;
  ulong uVar16;
  long lVar17;
  Var pvVar18;
  uint uVar19;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,op);
  switch(iVar2) {
  case 0xcb:
    pVVar4 = ByteCodeReader::ReadVarArrayVarCount
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d ",(ulong)playout->R0);
    pvVar18 = pVVar4->count;
    if (((ulong)pvVar18 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar18 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar18 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar13 = "(Is(aValue))";
        pcVar12 = "Ensure var is actually a \'TaggedInt\'";
        uVar15 = 0x43;
        goto LAB_007ecf83;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar13 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar12 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar15 = 0x2a;
LAB_007ecf83:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,uVar15,pcVar13,pcVar12);
      if (!bVar3) goto LAB_007ed1c3;
      *puVar7 = 0;
    }
    uVar19 = 0;
    uVar14 = (uint)pvVar18;
    Output::Print(L"= %d [",(ulong)pvVar18 & 0xffffffff);
    if (0 < (int)uVar14) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar19 = 2;
      if (uVar14 - 1 < 2) {
        uVar19 = uVar14 - 1;
      }
      uVar19 = uVar19 + 1;
      uVar16 = 0;
      do {
        if (uVar16 != 0) {
          Output::Print(L", ");
        }
        pvVar18 = pVVar4[uVar16 + 1].count;
        uVar11 = (ulong)pvVar18 & 0x1ffff00000000;
        if (uVar11 == 0x1000000000000 || ((ulong)pvVar18 & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)pvVar18 & 0xffff000000000000) == 0x1000000000000) goto LAB_007ed093;
          if ((ulong)pvVar18 >> 0x32 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                        ,0x600,"(false)","false");
            if (!bVar3) goto LAB_007ed1c3;
            *puVar7 = 0;
          }
          else {
            Output::Print(L"%g",(ulong)pvVar18 ^ 0xfffc000000000000);
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_007ed1c3;
          *puVar7 = 0;
          pvVar18 = pVVar4[uVar16 + 1].count;
          uVar11 = (ulong)pvVar18 & 0x1ffff00000000;
LAB_007ed093:
          if ((uVar11 == 0x1000000000000) ||
             (((ulong)pvVar18 & 0xffff000000000000) != 0x1000000000000)) {
            if (((ulong)pvVar18 & 0xffff000000000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar7 = 1;
              uVar15 = 0x43;
              pcVar13 = "(Is(aValue))";
              pcVar12 = "Ensure var is actually a \'TaggedInt\'";
              goto LAB_007ed112;
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            uVar15 = 0x2a;
            pcVar13 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
            pcVar12 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
LAB_007ed112:
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,uVar15,pcVar13,pcVar12);
            if (!bVar3) goto LAB_007ed1c3;
            *puVar7 = 0;
          }
          Output::Print(L"%d",(ulong)pvVar18 & 0xffffffff);
        }
        uVar16 = uVar16 + 1;
      } while (uVar19 != uVar16);
    }
    if (uVar19 == uVar14) goto LAB_007ecf21;
    goto LAB_007ecf13;
  case 0xce:
switchD_007ecba8_caseD_ce:
    pPVar5 = ByteCodeReader::ReadPropertyIdArray
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
    Output::Print(L" R%d ",(ulong)playout->R0);
    Output::Print(L"= %d [",(ulong)pPVar5->count);
    if (pPVar5->count != 0) {
      lVar17 = 2;
      uVar16 = 0;
      do {
        pPVar6 = ScriptContext::GetPropertyName(this,(&pPVar5->count)[lVar17]);
        if (lVar17 != 2) {
          Output::Print(L", ");
        }
        Output::Print(L"%s",pPVar6 + 1);
        if (1 < uVar16) break;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 1;
      } while (uVar16 < pPVar5->count);
      if (2 < pPVar5->count) {
        Output::Print(L", ...");
      }
    }
    Output::Print(L"], LiteralId %d",(ulong)(uint)(playout->super_OpLayoutAuxNoReg).C1);
    return;
  case 0xd2:
    pAVar9 = ByteCodeReader::ReadAuxArray<int>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar9->count);
    if (pAVar9->count == 0) goto LAB_007ecf21;
    uVar16 = 0;
    do {
      if (uVar16 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pAVar9[uVar16 + 1].count);
      uVar11 = uVar16 + 1;
      uVar19 = pAVar9->count;
    } while ((uVar16 < 2) && (uVar16 = uVar11, uVar11 < uVar19));
    break;
  case 0xd4:
    pAVar8 = ByteCodeReader::ReadAuxArray<double>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar8->count);
    if (pAVar8->count == 0) goto LAB_007ecf21;
    uVar16 = 0;
    do {
      if (uVar16 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%f",pAVar8[uVar16 + 1]);
      uVar11 = uVar16 + 1;
      uVar19 = pAVar8->count;
    } while ((uVar16 < 2) && (uVar16 = uVar11, uVar11 < uVar19));
    break;
  default:
    if (iVar2 == 0xa3) {
      pAVar10 = ByteCodeReader::ReadAuxArray<void*>
                          ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
      Output::Print(L" R%d ",(ulong)playout->R0);
      Output::Print(L"= %d [",(ulong)pAVar10->count);
      if (pAVar10->count == 0) goto LAB_007ecf21;
      uVar16 = 0;
      do {
        if (uVar16 != 0) {
          Output::Print(L", ");
        }
        Output::Print(L"%d",pAVar10[uVar16 + 1]);
        uVar11 = uVar16 + 1;
        uVar19 = pAVar10->count;
      } while ((uVar16 < 2) && (uVar16 = uVar11, uVar11 < uVar19));
      break;
    }
    if (iVar2 == 0xc1) goto switchD_007ecba8_caseD_ce;
  case 0xcc:
  case 0xcd:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd3:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x60b,"(false)","Unknown OpCode for OpLayoutType::Auxiliary");
    if (bVar3) {
      *puVar7 = 0;
      return;
    }
LAB_007ed1c3:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((uint)uVar11 != uVar19) {
LAB_007ecf13:
    Output::Print(L", ...");
  }
LAB_007ecf21:
  Output::Print(L"]");
  return;
}

Assistant:

void
    ByteCodeDumper::DumpAuxiliary(OpCode op, const unaligned OpLayoutAuxiliary * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewScObjectLiteral:
            case OpCode::LdPropIds:
            {
                const Js::PropertyIdArray *propIds = reader.ReadPropertyIdArray(playout->Offset, dumpFunction);
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), propIds->count);
                for (uint i=0; i< propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                if (propIds->count >= 3)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("], LiteralId %d"), playout->C1);
                break;
            }
            case OpCode::StArrSegItem_A:
            {
                const Js::VarArray *vars = reader.ReadAuxArray<Var>(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), vars->count);
                uint i=0;
                for (; i<vars->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), vars->elements[i]);
                }
                if (i != vars->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScIntArray:
            {
                const Js::AuxArray<int32> *intArray = reader.ReadAuxArray<int32>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, intArray->count);
                uint i;
                for (i = 0; i<intArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), intArray->elements[i]);
                }
                if (i != intArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScFltArray:
            {
                const Js::AuxArray<double> *dblArray = reader.ReadAuxArray<double>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, dblArray->count);
                uint i;
                for (i = 0; i<dblArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%f"), dblArray->elements[i]);
                }
                if (i != dblArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScObject_A:
            {
                const Js::VarArrayVarCount *vars = reader.ReadVarArrayVarCount(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                int count = Js::TaggedInt::ToInt32(vars->count);
                Output::Print(_u("= %d ["), count);
                int i=0;
                for (; i<count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    if (TaggedInt::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%d"), TaggedInt::ToInt32(vars->elements[i]));
                    }
                    else if (JavascriptNumber::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%g"), JavascriptNumber::GetValue(vars->elements[i]));
                    }
                    else
                    {
                        Assert(false);
                    }
                }
                if (i != count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutType::Auxiliary");
                break;
        }
    }